

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Type * __thiscall
soul::AST::TypeMetaFunction::resolveAsType(Type *__return_storage_ptr__,TypeMetaFunction *this)

{
  bool bVar1;
  uint uVar2;
  bool local_45;
  undefined1 local_44 [28];
  Type type;
  TypeMetaFunction *this_local;
  
  type.structure.object = (Structure *)this;
  uVar2 = (*(this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])();
  local_45 = false;
  if ((uVar2 & 1) != 0) {
    local_45 = operationReturnsAType(this->operation);
  }
  checkAssertion(local_45,"isResolved() && operationReturnsAType (operation)","resolveAsType",0x7a6)
  ;
  throwErrorIfUnresolved(this);
  getSourceType((Type *)(local_44 + 0x14),this);
  if (this->operation == sourceType) {
    Type::Type(__return_storage_ptr__,(Type *)(local_44 + 0x14));
  }
  else if (this->operation == makeConst) {
    Type::createConst(__return_storage_ptr__,(Type *)(local_44 + 0x14));
  }
  else if (this->operation == makeReference) {
    bVar1 = Type::isReference((Type *)(local_44 + 0x14));
    if (bVar1) {
      Type::Type(__return_storage_ptr__,(Type *)(local_44 + 0x14));
    }
    else {
      Type::createReference(__return_storage_ptr__,(Type *)(local_44 + 0x14));
    }
  }
  else if (this->operation == removeReference) {
    Type::removeReferenceIfPresent(__return_storage_ptr__,(Type *)(local_44 + 0x14));
  }
  else if (this->operation == elementType) {
    Type::getElementType(__return_storage_ptr__,(Type *)(local_44 + 0x14));
  }
  else {
    if (this->operation != primitiveType) {
      throwInternalCompilerError("resolveAsType",0x7b2);
    }
    Type::getPrimitiveType((Type *)local_44);
    Type::Type(__return_storage_ptr__,(PrimitiveType *)local_44);
  }
  local_44._4_4_ = void_;
  Type::~Type((Type *)(local_44 + 0x14));
  return __return_storage_ptr__;
}

Assistant:

Type resolveAsType() const override
        {
            SOUL_ASSERT (isResolved() && operationReturnsAType (operation));
            throwErrorIfUnresolved();

            auto type = getSourceType();

            if (operation == Op::sourceType)       return type;
            if (operation == Op::makeConst)        return type.createConst();
            if (operation == Op::makeReference)    return type.isReference() ? type : type.createReference();
            if (operation == Op::removeReference)  return type.removeReferenceIfPresent();
            if (operation == Op::elementType)      return type.getElementType();
            if (operation == Op::primitiveType)    return type.getPrimitiveType();

            SOUL_ASSERT_FALSE; return {};
        }